

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ChainPromiseNode::tracePromise
          (ChainPromiseNode *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  PromiseNode *pPVar1;
  undefined7 in_register_00000011;
  
  if (((int)CONCAT71(in_register_00000011,stopAtNextEvent) != 0) && (this->state == STEP1)) {
    return;
  }
  pPVar1 = (this->inner).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])
            (pPVar1,builder,(ulong)stopAtNextEvent);
  return;
}

Assistant:

void ChainPromiseNode::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  if (stopAtNextEvent && state == STEP1) {
    // In STEP1, we are an Event -- when the inner node resolves, it will arm *this* object.
    // In STEP2, we are not an Event -- when the inner node resolves, it directly arms our parent
    // event.
    return;
  }

  inner->tracePromise(builder, stopAtNextEvent);
}